

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.hpp
# Opt level: O3

void __thiscall procxx::process::exec(process *this)

{
  pipe_t *ppVar1;
  pointer pbVar2;
  process *ppVar3;
  __pid_t _Var4;
  pipe_end pVar5;
  ssize_t sVar6;
  exception *this_00;
  int *piVar7;
  runtime_error *prVar8;
  long *plVar9;
  size_t in_RCX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  int iVar10;
  undefined1 *puVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  pointer pbVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  process *ppVar13;
  pipe_t err_pipe;
  char err [4];
  vector<char_*,_std::allocator<char_*>_> args;
  char err_1 [4];
  pipe_t local_84;
  undefined4 local_7c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  int local_50;
  undefined4 uStack_4c;
  undefined4 *__buf;
  
  if (this->pid_ != -1) {
    this_00 = (exception *)__cxa_allocate_exception(0x10);
    exception::runtime_error(this_00,"process already started");
    __cxa_throw(this_00,&exception::typeinfo,std::runtime_error::~runtime_error);
  }
  pipe_t::pipe_t(&local_84);
  _Var4 = fork();
  if (_Var4 == -1) {
    perror("fork()");
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar8,"Failed to fork child process");
    *(undefined ***)prVar8 = &PTR__runtime_error_00173260;
    __cxa_throw(prVar8,&exception::typeinfo,std::runtime_error::~runtime_error);
  }
  if (_Var4 == 0) {
    pVar5 = pipe_t::read_end();
    iVar10 = local_84.pipe_._M_elems[pVar5.end_];
    if (iVar10 != -1) {
      close(iVar10);
      local_84.pipe_._M_elems[pVar5.end_] = -1;
    }
    pVar5 = pipe_t::write_end();
    this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &(this->pipe_buf_).stdin_pipe_;
    iVar10 = (((pipe_t *)this_01)->pipe_)._M_elems[pVar5.end_];
    if (iVar10 != -1) {
      close(iVar10);
      (((pipe_t *)this_01)->pipe_)._M_elems[pVar5.end_] = -1;
    }
    pVar5 = pipe_t::read_end();
    ppVar1 = &(this->pipe_buf_).super_pipe_ostreambuf.stdout_pipe_;
    iVar10 = (ppVar1->pipe_)._M_elems[pVar5.end_];
    if (iVar10 != -1) {
      close(iVar10);
      (ppVar1->pipe_)._M_elems[pVar5.end_] = -1;
    }
    pVar5 = pipe_t::write_end();
    pipe_t::dup(ppVar1,pVar5.end_);
    pVar5 = pipe_t::read_end();
    ppVar1 = &(this->err_buf_).stdout_pipe_;
    iVar10 = (ppVar1->pipe_)._M_elems[pVar5.end_];
    if (iVar10 != -1) {
      close(iVar10);
      (ppVar1->pipe_)._M_elems[pVar5.end_] = -1;
    }
    pVar5 = pipe_t::write_end();
    puVar11 = (undefined1 *)(ulong)pVar5.end_;
    pipe_t::dup(ppVar1,pVar5.end_);
    ppVar13 = this->read_from_;
    if (ppVar13 != (process *)0x0) goto LAB_00125942;
    pVar5 = pipe_t::read_end();
    do {
      pipe_t::dup((pipe_t *)this_01,pVar5.end_);
      local_78._M_dataplus._M_p = (pointer)0x0;
      local_78._M_string_length = 0;
      local_78.field_2._M_allocated_capacity = 0;
      std::vector<char_*,_std::allocator<char_*>_>::reserve
                ((vector<char_*,_std::allocator<char_*>_> *)&local_78,
                 ((long)(this->args_).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->args_).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
      pbVar12 = (this->args_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 = (this->args_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar12 != pbVar2) {
        this_01 = &local_78;
        ppVar13 = (process *)&stack0xffffffffffffffb0;
        do {
          _local_50 = (pbVar12->_M_dataplus)._M_p;
          std::vector<char*,std::allocator<char*>>::emplace_back<char*>
                    ((vector<char*,std::allocator<char*>> *)this_01,(char **)ppVar13);
          pbVar12 = pbVar12 + 1;
        } while (pbVar12 != pbVar2);
      }
      _local_50 = (pointer)0x0;
      std::vector<char*,std::allocator<char*>>::emplace_back<char*>
                ((vector<char*,std::allocator<char*>> *)&local_78,(char **)&stack0xffffffffffffffb0)
      ;
      this = (process *)&this->limits_;
      limits_t::set_limits((limits_t *)this);
      execvp(*(char **)local_78._M_dataplus._M_p,(char **)local_78._M_dataplus._M_p);
      piVar7 = __errno_location();
      puVar11 = (undefined1 *)&stack0xffffffffffffffb0;
      local_50 = *piVar7;
      pipe_t::write(&local_84,(int)puVar11,(void *)0x4,in_RCX);
      pipe_t::close(&local_84,(int)puVar11);
      _Exit(1);
LAB_00125942:
      do {
        pipe_t::close(&(ppVar13->pipe_buf_).stdin_pipe_,(int)puVar11);
        ppVar13 = ppVar13->read_from_;
      } while (ppVar13 != (process *)0x0);
      pVar5 = pipe_t::read_end();
      ppVar13 = (process *)(ulong)pVar5.end_;
      iVar10 = *(int *)((long)&(this_01->_M_dataplus)._M_p + (long)ppVar13 * 4);
      if (iVar10 != -1) {
        close(iVar10);
        *(undefined4 *)((long)&(this_01->_M_dataplus)._M_p + (long)ppVar13 * 4) = 0xffffffff;
      }
      ppVar3 = this->read_from_;
      pVar5 = pipe_t::read_end();
      this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &(ppVar3->pipe_buf_).super_pipe_ostreambuf.stdout_pipe_;
    } while( true );
  }
  pVar5 = pipe_t::write_end();
  iVar10 = local_84.pipe_._M_elems[pVar5.end_];
  if (iVar10 != -1) {
    close(iVar10);
    local_84.pipe_._M_elems[pVar5.end_] = -1;
  }
  pVar5 = pipe_t::write_end();
  iVar10 = (this->pipe_buf_).super_pipe_ostreambuf.stdout_pipe_.pipe_._M_elems[pVar5.end_];
  if (iVar10 != -1) {
    close(iVar10);
    (this->pipe_buf_).super_pipe_ostreambuf.stdout_pipe_.pipe_._M_elems[pVar5.end_] = -1;
  }
  pVar5 = pipe_t::write_end();
  iVar10 = (this->err_buf_).stdout_pipe_.pipe_._M_elems[pVar5.end_];
  if (iVar10 != -1) {
    close(iVar10);
    (this->err_buf_).stdout_pipe_.pipe_._M_elems[pVar5.end_] = -1;
  }
  pVar5 = pipe_t::read_end();
  iVar10 = (this->pipe_buf_).stdin_pipe_.pipe_._M_elems[pVar5.end_];
  if (iVar10 != -1) {
    close(iVar10);
    (this->pipe_buf_).stdin_pipe_.pipe_._M_elems[pVar5.end_] = -1;
  }
  if (this->read_from_ != (process *)0x0) {
    pVar5 = pipe_t::write_end();
    iVar10 = (this->pipe_buf_).stdin_pipe_.pipe_._M_elems[pVar5.end_];
    if (iVar10 != -1) {
      close(iVar10);
      (this->pipe_buf_).stdin_pipe_.pipe_._M_elems[pVar5.end_] = -1;
    }
    ppVar13 = this->read_from_;
    pVar5 = pipe_t::read_end();
    iVar10 = (ppVar13->pipe_buf_).super_pipe_ostreambuf.stdout_pipe_.pipe_._M_elems[pVar5.end_];
    if (iVar10 != -1) {
      close(iVar10);
      (ppVar13->pipe_buf_).super_pipe_ostreambuf.stdout_pipe_.pipe_._M_elems[pVar5.end_] = -1;
    }
    ppVar13 = this->read_from_;
    pVar5 = pipe_t::read_end();
    iVar10 = (ppVar13->err_buf_).stdout_pipe_.pipe_._M_elems[pVar5.end_];
    if (iVar10 != -1) {
      close(iVar10);
      (ppVar13->err_buf_).stdout_pipe_.pipe_._M_elems[pVar5.end_] = -1;
    }
  }
  this->pid_ = _Var4;
  __buf = &local_7c;
  sVar6 = read(local_84.pipe_._M_elems[0],__buf,4);
  iVar10 = (int)__buf;
  if (sVar6 != 4) {
    pipe_t::close(&local_84,iVar10);
    pipe_t::close(&local_84,iVar10);
    return;
  }
  prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
  plVar9 = (long *)std::_V2::system_category();
  (**(code **)(*plVar9 + 0x20))(&stack0xffffffffffffffb0,plVar9,local_7c);
  std::operator+(&local_78,"Failed to exec process: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xffffffffffffffb0);
  std::runtime_error::runtime_error(prVar8,(string *)&local_78);
  *(undefined ***)prVar8 = &PTR__runtime_error_00173260;
  __cxa_throw(prVar8,&exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void exec() {
    if (pid_ != -1)
      throw exception{"process already started"};

    pipe_t err_pipe;

    auto pid = fork();
    if (pid == -1) {
      perror("fork()");
      throw exception{"Failed to fork child process"};
    } else if (pid == 0) {
      err_pipe.close(pipe_t::read_end());
      pipe_buf_.stdin_pipe().close(pipe_t::write_end());
      pipe_buf_.stdout_pipe().close(pipe_t::read_end());
      pipe_buf_.stdout_pipe().dup(pipe_t::write_end(), STDOUT_FILENO);
      err_buf_.stdout_pipe().close(pipe_t::read_end());
      err_buf_.stdout_pipe().dup(pipe_t::write_end(), STDERR_FILENO);

      if (read_from_) {
        read_from_->recursive_close_stdin();
        pipe_buf_.stdin_pipe().close(pipe_t::read_end());
        read_from_->pipe_buf_.stdout_pipe().dup(pipe_t::read_end(),
                                                STDIN_FILENO);
      } else {
        pipe_buf_.stdin_pipe().dup(pipe_t::read_end(), STDIN_FILENO);
      }

      std::vector<char*> args;
      args.reserve(args_.size() + 1);
      for (auto& arg : args_)
        args.push_back(const_cast<char*>(arg.c_str()));
      args.push_back(nullptr);

      limits_.set_limits();
      execvp(args[0], args.data());

      char err[sizeof(int)];
      std::memcpy(err, &errno, sizeof(int));
      err_pipe.write(err, sizeof(int));
      err_pipe.close();
      std::_Exit(EXIT_FAILURE);
    } else {
      err_pipe.close(pipe_t::write_end());
      pipe_buf_.stdout_pipe().close(pipe_t::write_end());
      err_buf_.stdout_pipe().close(pipe_t::write_end());
      pipe_buf_.stdin_pipe().close(pipe_t::read_end());
      if (read_from_) {
        pipe_buf_.stdin_pipe().close(pipe_t::write_end());
        read_from_->pipe_buf_.stdout_pipe().close(pipe_t::read_end());
        read_from_->err_buf_.stdout_pipe().close(pipe_t::read_end());
      }
      pid_ = pid;

      char err[sizeof(int)];
      auto bytes = err_pipe.read(err, sizeof(int));
      if (bytes == sizeof(int)) {
        int ec = 0;
        std::memcpy(&ec, err, sizeof(int));
        throw exception{"Failed to exec process: " +
                        std::system_category().message(ec)};
      } else {
        err_pipe.close();
      }
    }
  }